

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

bool __thiscall
ON_ComponentManifestTableIndex::AddSystemItem
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *system_item)

{
  Type TVar1;
  int iVar2;
  ON_ComponentManifestItem_PRIVATE *pOVar3;
  bool bVar4;
  bool bValidSystemComponentIndex;
  ON_ComponentManifestItem_PRIVATE *system_item_local;
  ON_ComponentManifestTableIndex *this_local;
  
  if ((system_item != (ON_ComponentManifestItem_PRIVATE *)0x0) &&
     (TVar1 = ON_ComponentManifestItem::ComponentType(&system_item->super_ON_ComponentManifestItem),
     TVar1 == this->m_component_type)) {
    iVar2 = ON_ComponentManifestItem::Index(&system_item->super_ON_ComponentManifestItem);
    pOVar3 = SystemItemFromIndex(this,iVar2);
    if ((pOVar3 == (ON_ComponentManifestItem_PRIVATE *)0x0) &&
       ((system_item->m_manifest_table_sn == 0 && (this->m_component_type != Unset)))) {
      if ((this->m_bIndexedComponent & 1U) == 0) {
        iVar2 = ON_ComponentManifestItem::Index(&system_item->super_ON_ComponentManifestItem);
        bVar4 = iVar2 == -0x7fffffff;
      }
      else {
        iVar2 = ON_ComponentManifestItem::Index(&system_item->super_ON_ComponentManifestItem);
        bVar4 = false;
        if (iVar2 < 0) {
          iVar2 = ON_ComponentManifestItem::Index(&system_item->super_ON_ComponentManifestItem);
          bVar4 = -0x7fffffff < iVar2;
        }
      }
      if (bVar4) {
        system_item->m_prev = this->m_last_system_item;
        system_item->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
        if (this->m_last_system_item == (ON_ComponentManifestItem_PRIVATE *)0x0) {
          this->m_first_system_item = system_item;
        }
        else {
          this->m_last_system_item->m_next = system_item;
        }
        this->m_last_system_item = system_item;
        this->m_system_item_count = this->m_system_item_count + 1;
        system_item->m_manifest_table_sn = this->m_manifest_table_sn;
        return true;
      }
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,0xc38,"","Invalid system item parameter.");
  return false;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddSystemItem(
  ON_ComponentManifestItem_PRIVATE* system_item
  )
{
  if ( nullptr != system_item
    && system_item->ComponentType() == m_component_type
    && nullptr == SystemItemFromIndex(system_item->Index())
    && 0 == system_item->m_manifest_table_sn
    && ON_ModelComponent::Type::Unset != m_component_type
    )
  {
    const bool bValidSystemComponentIndex
      = m_bIndexedComponent
      ? (system_item->Index() < 0 && system_item->Index() > ON_UNSET_INT_INDEX)
      : (ON_UNSET_INT_INDEX == system_item->Index());
    if (bValidSystemComponentIndex)
    {
      system_item->m_prev = m_last_system_item;
      system_item->m_next = nullptr;
      if (nullptr != m_last_system_item)
        m_last_system_item->m_next = system_item;
      else
        m_first_system_item = system_item;
      m_last_system_item = system_item;
      m_system_item_count++;
      system_item->m_manifest_table_sn = m_manifest_table_sn;
      return true;
    }
  }
  ON_ERROR("Invalid system item parameter.");
  return false;
}